

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O3

void PrintFullLosslessInfo(WebPAuxStats *stats,char *description)

{
  uint uVar1;
  
  fprintf(stderr,"Lossless-%s compressed size: %d bytes\n",description,
          (ulong)(uint)stats->lossless_size);
  fprintf(stderr,"  * Header size: %d bytes, image data size: %d\n",
          (ulong)(uint)stats->lossless_hdr_size,(ulong)(uint)stats->lossless_data_size);
  if (stats->lossless_features != 0) {
    fwrite("  * Lossless features used:",0x1b,1,stderr);
    uVar1 = stats->lossless_features;
    if ((uVar1 & 1) != 0) {
      fwrite(" PREDICTION",0xb,1,stderr);
      uVar1 = stats->lossless_features;
    }
    if ((uVar1 & 2) != 0) {
      fwrite(" CROSS-COLOR-TRANSFORM",0x16,1,stderr);
      uVar1 = stats->lossless_features;
    }
    if ((uVar1 & 4) != 0) {
      fwrite(" SUBTRACT-GREEN",0xf,1,stderr);
      uVar1 = stats->lossless_features;
    }
    if ((uVar1 & 8) != 0) {
      fwrite(" PALETTE",8,1,stderr);
    }
    fputc(10,stderr);
  }
  fprintf(stderr,"  * Precision Bits: histogram=%d",(ulong)(uint)stats->histogram_bits);
  uVar1 = stats->lossless_features;
  if ((uVar1 & 1) != 0) {
    fprintf(stderr," prediction=%d",(ulong)(uint)stats->transform_bits);
    uVar1 = stats->lossless_features;
  }
  if ((uVar1 & 2) != 0) {
    fprintf(stderr," cross-color=%d",(ulong)(uint)stats->cross_color_transform_bits);
  }
  fprintf(stderr," cache=%d\n",(ulong)(uint)stats->cache_bits);
  if (stats->palette_size < 1) {
    return;
  }
  fprintf(stderr,"  * Palette size:   %d\n");
  return;
}

Assistant:

static void PrintFullLosslessInfo(const WebPAuxStats* const stats,
                                  const char* const description) {
  fprintf(stderr, "Lossless-%s compressed size: %d bytes\n",
          description, stats->lossless_size);
  fprintf(stderr, "  * Header size: %d bytes, image data size: %d\n",
          stats->lossless_hdr_size, stats->lossless_data_size);
  if (stats->lossless_features) {
    fprintf(stderr, "  * Lossless features used:");
    if (stats->lossless_features & 1) fprintf(stderr, " PREDICTION");
    if (stats->lossless_features & 2) fprintf(stderr, " CROSS-COLOR-TRANSFORM");
    if (stats->lossless_features & 4) fprintf(stderr, " SUBTRACT-GREEN");
    if (stats->lossless_features & 8) fprintf(stderr, " PALETTE");
    fprintf(stderr, "\n");
  }
  fprintf(stderr, "  * Precision Bits: histogram=%d", stats->histogram_bits);
  if (stats->lossless_features & 1) {
    fprintf(stderr, " prediction=%d", stats->transform_bits);
  }
  if (stats->lossless_features & 2) {
    fprintf(stderr, " cross-color=%d", stats->cross_color_transform_bits);
  }
  fprintf(stderr, " cache=%d\n", stats->cache_bits);
  if (stats->palette_size > 0) {
    fprintf(stderr, "  * Palette size:   %d\n", stats->palette_size);
  }
}